

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

bool __thiscall
sptk::reaper::EpochTracker::Init
          (EpochTracker *this,int16_t *input,int32_t n_input,float sample_rate,float min_f0_search,
          float max_f0_search,bool do_highpass,bool do_hilbert_transform)

{
  reference pvVar1;
  byte in_CL;
  int in_EDX;
  int16_t *in_RSI;
  size_type in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float *in_stack_00000028;
  int32_t i;
  int16_t *input_p;
  undefined6 in_stack_00000038;
  float in_stack_00000078;
  float in_stack_0000007c;
  float in_stack_00000080;
  int32_t in_stack_00000084;
  int16_t *in_stack_00000088;
  EpochTracker *in_stack_00000090;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  int16_t *local_38;
  bool local_1;
  
  if ((((in_RSI == (int16_t *)0x0) || (in_XMM0_Da <= 6000.0)) ||
      ((float)in_EDX <= in_XMM0_Da * 0.05)) || ((in_XMM2_Da <= in_XMM1_Da || (in_XMM1_Da <= 0.0))))
  {
    local_1 = false;
  }
  else {
    CleanUp((EpochTracker *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    *(float *)(in_RDI + 0x168) = in_XMM1_Da;
    *(float *)(in_RDI + 0x16c) = in_XMM2_Da;
    *(float *)(in_RDI + 0x128) = in_XMM0_Da;
    local_38 = in_RSI;
    if ((in_CL & 1) != 0) {
      local_38 = HighpassFilter(in_stack_00000090,in_stack_00000088,in_stack_00000084,
                                in_stack_00000080,in_stack_0000007c,in_stack_00000078);
    }
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
    if ((in_R8B & 1) == 0) {
      for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
        fVar2 = (float)(int)local_38[iVar3];
        pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x38),(long)iVar3);
        *pvVar1 = fVar2;
      }
    }
    else {
      std::vector<float,_std::allocator<float>_>::front
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      HilbertTransform((EpochTracker *)CONCAT44(min_f0_search,max_f0_search),
                       (int16_t *)
                       CONCAT17(do_highpass,CONCAT16(do_hilbert_transform,in_stack_00000038)),
                       input_p._4_4_,in_stack_00000028);
    }
    if ((local_38 != in_RSI) && (local_38 != (int16_t *)0x0)) {
      operator_delete__(local_38);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool EpochTracker::Init(const int16_t* input, int32_t n_input, float sample_rate,
                        float min_f0_search, float max_f0_search,
                        bool do_highpass, bool do_hilbert_transform) {
#if 0
  if (input && (sample_rate > 6000.0) && (n_input > (sample_rate * 0.05)) &&
#else
  if (input && (sample_rate > kMinSampleRate) && (n_input > (sample_rate * 0.05)) &&
#endif
      (min_f0_search < max_f0_search) && (min_f0_search > 0.0)) {
    CleanUp();
    min_f0_search_ = min_f0_search;
    max_f0_search_ = max_f0_search;
    sample_rate_ = sample_rate;
    int16_t* input_p = const_cast<int16_t *>(input);
    if (do_highpass) {
      input_p = HighpassFilter(input_p, n_input, sample_rate,
                               corner_frequency_, filter_duration_);
    }
    signal_.resize(n_input);
    if (do_hilbert_transform) {
      HilbertTransform(input_p, n_input, &(signal_.front()));
    } else {
      for (int32_t i = 0; i < n_input; ++i) {
        signal_[i] = input_p[i];
      }
    }
    if (input_p != input) {
      delete [] input_p;
    }
    return true;
  }